

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<FileHeader>::relocate
          (QArrayDataPointer<FileHeader> *this,qsizetype offset,FileHeader **data)

{
  FileHeader *d_first;
  FileHeader *pFVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<FileHeader,long_long>(this->ptr,this->size,d_first);
  if (data != (FileHeader **)0x0) {
    pFVar1 = *data;
    if ((this->ptr <= pFVar1) && (pFVar1 < this->ptr + this->size)) {
      *data = pFVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }